

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  Option *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *this_01;
  ConfigError *__return_storage_ptr__;
  size_t sVar5;
  element_type *peVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined1 local_e1;
  string local_e0 [2];
  OptionNotFound *anon_var_0;
  Option *local_70;
  Option *op;
  OptionNotFound *anon_var_0_1;
  App *local_30;
  App *subcom;
  size_t level_local;
  ConfigItem *item_local;
  App *this_local;
  
  subcom = (App *)level;
  level_local = (size_t)item;
  item_local = (ConfigItem *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&item->parents);
  if (level < sVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)level_local,(size_type)subcom);
    this_01 = ::std::operator<<((ostream *)&::std::cout,(string *)pvVar4);
    ::std::ostream::operator<<(this_01,::std::endl<char,std::char_traits<char>>);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)level_local,(size_type)subcom);
    ::std::__cxx11::string::string((string *)&anon_var_0_1,(string *)pvVar4);
    local_30 = get_subcommand(this,(string *)&anon_var_0_1);
    ::std::__cxx11::string::~string((string *)&anon_var_0_1);
    this_local._7_1_ =
         _parse_single_config
                   (local_30,(ConfigItem *)level_local,(size_t)((long)&subcom->_vptr_App + 1));
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &anon_var_0,"--",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (level_local + 0x18));
    local_70 = get_option(this,(string *)&anon_var_0);
    ::std::__cxx11::string::~string((string *)&anon_var_0);
    bVar1 = OptionBase<CLI::Option>::get_configurable(&local_70->super_OptionBase<CLI::Option>);
    if (!bVar1) {
      local_e1 = 1;
      __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
      ConfigItem::fullname_abi_cxx11_(local_e0,(ConfigItem *)level_local);
      ConfigError::NotConfigurable(__return_storage_ptr__,local_e0);
      local_e1 = 0;
      __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    sVar5 = Option::empty(local_70);
    if (sVar5 != 0) {
      iVar2 = Option::get_type_size(local_70);
      this_00 = local_70;
      if (iVar2 == 0) {
        peVar6 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->config_formatter_);
        (*peVar6->_vptr_Config[2])(&local_100,peVar6,level_local);
        Option::set_results(this_00,&local_100);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_100);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(level_local + 0x38));
        Option::set_results(this_00,&local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        Option::run_callback(local_70);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool _parse_single_config(const ConfigItem &item, size_t level = 0) {
        if(level < item.parents.size()) {
            App *subcom;
            try {
                std::cout << item.parents.at(level) << std::endl;
                subcom = get_subcommand(item.parents.at(level));
            } catch(const OptionNotFound &) {
                return false;
            }
            return subcom->_parse_single_config(item, level + 1);
        }

        Option *op;
        try {
            op = get_option("--" + item.name);
        } catch(const OptionNotFound &) {
            // If the option was not present
            if(get_allow_config_extras())
                // Should we worry about classifying the extras properly?
                missing_.emplace_back(detail::Classifer::NONE, item.fullname());
            return false;
        }

        if(!op->get_configurable())
            throw ConfigError::NotConfigurable(item.fullname());

        if(op->empty()) {
            // Flag parsing
            if(op->get_type_size() == 0) {
                op->set_results(config_formatter_->to_flag(item));
            } else {
                op->set_results(item.inputs);
                op->run_callback();
            }
        }

        return true;
    }